

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_art_iter.cpp
# Opt level: O0

void __thiscall
anon_unknown.dwarf_d5c8::
ARTIteratorTest_seekThreeLeavesUnderTheRoot_Test<unodb::mutex_db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>_>
::TestBody(ARTIteratorTest_seekThreeLeavesUnderTheRoot_Test<unodb::mutex_db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>_>
           *this)

{
  value_view v;
  value_view v_00;
  value_view v_01;
  bool bVar1;
  const_reference pvVar2;
  char *pcVar3;
  char *in_R9;
  key_type kVar4;
  key_view akey;
  key_view akey_00;
  key_view akey_01;
  key_view akey_02;
  key_view akey_03;
  key_view akey_04;
  key_view akey_05;
  key_view akey_06;
  undefined8 in_stack_ffffffffffffe370;
  tree_verifier<unodb::mutex_db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>_>
  *in_stack_ffffffffffffe378;
  string local_1bf0;
  AssertHelper local_1bd0;
  Message local_1bc8;
  bool local_1bb9;
  undefined1 local_1bb8 [8];
  AssertionResult gtest_ar__28;
  AssertHelper local_1b88;
  Message local_1b80 [2];
  value_view local_1b70;
  bool local_1b59;
  undefined1 local_1b58 [8];
  AssertionResult gtest_ar__27;
  Message local_1b40;
  key_view local_1b38;
  uint64_t local_1b28;
  undefined1 local_1b20 [8];
  AssertionResult gtest_ar_7;
  AssertHelper local_1af0;
  Message local_1ae8;
  bool local_1ad9;
  undefined1 local_1ad8 [8];
  AssertionResult gtest_ar__26;
  AssertHelper local_1aa8;
  Message local_1aa0;
  bool local_1a91;
  undefined1 local_1a90 [8];
  AssertionResult gtest_ar__25;
  anon_union_16_2_3c23a32d_for_basic_art_key<std::span<const_std::byte,_18446744073709551615UL>_>_1
  local_1a70;
  undefined1 local_1a60 [8];
  iterator it_9;
  undefined1 local_18e8 [7];
  bool match_9;
  AssertHelper local_18c8;
  Message local_18c0;
  bool local_18b1;
  undefined1 local_18b0 [8];
  AssertionResult gtest_ar__24;
  AssertHelper local_1880;
  Message local_1878;
  bool local_1869;
  undefined1 local_1868 [8];
  AssertionResult gtest_ar__23;
  anon_union_16_2_3c23a32d_for_basic_art_key<std::span<const_std::byte,_18446744073709551615UL>_>_1
  local_1848;
  undefined1 local_1838 [8];
  iterator it_8;
  undefined1 local_16c0 [7];
  bool match_8;
  AssertHelper local_16a0;
  Message local_1698;
  bool local_1689;
  undefined1 local_1688 [8];
  AssertionResult gtest_ar__22;
  AssertHelper local_1658;
  Message local_1650;
  bool local_1641;
  undefined1 local_1640 [8];
  AssertionResult gtest_ar__21;
  anon_union_16_2_3c23a32d_for_basic_art_key<std::span<const_std::byte,_18446744073709551615UL>_>_1
  local_1620;
  undefined1 local_1610 [8];
  iterator it_7;
  undefined1 local_1498 [7];
  bool match_7;
  AssertHelper local_1478;
  Message local_1470 [2];
  value_view local_1460;
  bool local_1449;
  undefined1 local_1448 [8];
  AssertionResult gtest_ar__20;
  Message local_1430;
  key_view local_1428;
  uint64_t local_1418;
  undefined1 local_1410 [8];
  AssertionResult gtest_ar_6;
  AssertHelper local_13e0;
  Message local_13d8;
  bool local_13c9;
  undefined1 local_13c8 [8];
  AssertionResult gtest_ar__19;
  AssertHelper local_1398;
  Message local_1390;
  bool local_1381;
  undefined1 local_1380 [8];
  AssertionResult gtest_ar__18;
  anon_union_16_2_3c23a32d_for_basic_art_key<std::span<const_std::byte,_18446744073709551615UL>_>_1
  local_1360;
  undefined1 local_1350 [8];
  iterator it_6;
  undefined1 local_11d8 [7];
  bool match_6;
  AssertHelper local_11b8;
  Message local_11b0 [2];
  value_view local_11a0;
  bool local_1189;
  undefined1 local_1188 [8];
  AssertionResult gtest_ar__17;
  Message local_1170;
  key_view local_1168;
  uint64_t local_1158;
  undefined1 local_1150 [8];
  AssertionResult gtest_ar_5;
  AssertHelper local_1120;
  Message local_1118;
  undefined1 local_1110 [8];
  AssertionResult gtest_ar__16;
  AssertHelper local_10e0;
  Message local_10d8;
  bool local_10c9;
  undefined1 local_10c8 [8];
  AssertionResult gtest_ar__15;
  anon_union_16_2_3c23a32d_for_basic_art_key<std::span<const_std::byte,_18446744073709551615UL>_>_1
  local_10a8;
  undefined1 local_1098 [8];
  iterator it_5;
  undefined1 local_f20 [7];
  bool match_5;
  AssertHelper local_f00;
  Message local_ef8 [2];
  value_view local_ee8;
  bool local_ed1;
  undefined1 local_ed0 [8];
  AssertionResult gtest_ar__14;
  Message local_eb8;
  key_view local_eb0;
  uint64_t local_ea0;
  undefined1 local_e98 [8];
  AssertionResult gtest_ar_4;
  AssertHelper local_e68;
  Message local_e60;
  undefined1 local_e58 [8];
  AssertionResult gtest_ar__13;
  AssertHelper local_e28;
  Message local_e20;
  bool local_e11;
  undefined1 local_e10 [8];
  AssertionResult gtest_ar__12;
  anon_union_16_2_3c23a32d_for_basic_art_key<std::span<const_std::byte,_18446744073709551615UL>_>_1
  local_df0;
  undefined1 local_de0 [8];
  iterator it_4;
  undefined1 local_c68 [7];
  bool match_4;
  AssertHelper local_c48;
  Message local_c40 [2];
  value_view local_c30;
  bool local_c19;
  undefined1 local_c18 [8];
  AssertionResult gtest_ar__11;
  Message local_c00;
  key_view local_bf8;
  uint64_t local_be8;
  undefined1 local_be0 [8];
  AssertionResult gtest_ar_3;
  AssertHelper local_bb0;
  Message local_ba8;
  undefined1 local_ba0 [8];
  AssertionResult gtest_ar__10;
  AssertHelper local_b70;
  Message local_b68;
  bool local_b59;
  undefined1 local_b58 [8];
  AssertionResult gtest_ar__9;
  anon_union_16_2_3c23a32d_for_basic_art_key<std::span<const_std::byte,_18446744073709551615UL>_>_1
  local_b38;
  undefined1 local_b28 [8];
  iterator it_3;
  undefined1 local_9b0 [7];
  bool match_3;
  AssertHelper local_990;
  Message local_988 [2];
  value_view local_978;
  bool local_961;
  undefined1 local_960 [8];
  AssertionResult gtest_ar__8;
  Message local_948;
  key_view local_940;
  uint64_t local_930;
  undefined1 local_928 [8];
  AssertionResult gtest_ar_2;
  AssertHelper local_8f8;
  Message local_8f0;
  undefined1 local_8e8 [8];
  AssertionResult gtest_ar__7;
  AssertHelper local_8b8;
  Message local_8b0;
  bool local_8a1;
  undefined1 local_8a0 [8];
  AssertionResult gtest_ar__6;
  anon_union_16_2_3c23a32d_for_basic_art_key<std::span<const_std::byte,_18446744073709551615UL>_>_1
  local_880;
  undefined1 local_870 [8];
  iterator it_2;
  undefined1 local_6f8 [7];
  bool match_2;
  AssertHelper local_6d8;
  Message local_6d0 [2];
  value_view local_6c0;
  bool local_6a9;
  undefined1 local_6a8 [8];
  AssertionResult gtest_ar__5;
  Message local_690;
  key_view local_688;
  uint64_t local_678;
  undefined1 local_670 [8];
  AssertionResult gtest_ar_1;
  AssertHelper local_640;
  Message local_638;
  undefined1 local_630 [8];
  AssertionResult gtest_ar__4;
  AssertHelper local_600;
  Message local_5f8;
  bool local_5e9;
  undefined1 local_5e8 [8];
  AssertionResult gtest_ar__3;
  anon_union_16_2_3c23a32d_for_basic_art_key<std::span<const_std::byte,_18446744073709551615UL>_>_1
  local_5c8;
  undefined1 local_5b8 [8];
  iterator it_1;
  undefined1 local_440 [7];
  bool match_1;
  AssertHelper local_420;
  Message local_418 [2];
  value_view local_408;
  bool local_3f1;
  undefined1 local_3f0 [8];
  AssertionResult gtest_ar__2;
  Message local_3d8;
  key_view local_3d0;
  uint64_t local_3c0;
  undefined1 local_3b8 [8];
  AssertionResult gtest_ar;
  AssertHelper local_388;
  Message local_380;
  undefined1 local_378 [8];
  AssertionResult gtest_ar__1;
  AssertHelper local_348;
  Message local_340;
  bool local_331;
  undefined1 local_330 [8];
  AssertionResult gtest_ar_;
  anon_union_16_2_3c23a32d_for_basic_art_key<std::span<const_std::byte,_18446744073709551615UL>_>_1
  local_310;
  undefined1 local_300 [8];
  iterator it;
  bool match;
  unsigned_long local_140;
  uint64_t k2;
  uint64_t k1;
  uint64_t k0;
  TypeParam *db;
  tree_verifier<unodb::mutex_db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>_>
  verifier;
  bool debug;
  ARTIteratorTest_seekThreeLeavesUnderTheRoot_Test<unodb::mutex_db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>_>
  *this_local;
  
  verifier.key_views.
  super__Vector_base<std::array<std::byte,_8UL>,_std::allocator<std::array<std::byte,_8UL>_>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage._7_1_ = 0;
  unodb::test::
  tree_verifier<unodb::mutex_db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>_>
  ::tree_verifier(in_stack_ffffffffffffe378,SUB81((ulong)in_stack_ffffffffffffe370 >> 0x38,0));
  k0 = (uint64_t)
       unodb::test::
       tree_verifier<unodb::mutex_db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>_>
       ::get_db((tree_verifier<unodb::mutex_db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>_>
                 *)&db);
  k1 = 0xaa10;
  k2 = 0xaa20;
  local_140 = 0xaa30;
  pvVar2 = std::array<std::span<const_std::byte,_18446744073709551615UL>,_6UL>::operator[]
                     ((array<std::span<const_std::byte,_18446744073709551615UL>,_6UL> *)
                      unodb::test::test_values,0);
  v._M_ptr = pvVar2->_M_ptr;
  v._M_extent._M_extent_value = (pvVar2->_M_extent)._M_extent_value;
  unodb::test::
  tree_verifier<unodb::mutex_db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>_>
  ::insert<unsigned_long>
            ((tree_verifier<unodb::mutex_db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>_>
              *)&db,0xaa10,v,false);
  pvVar2 = std::array<std::span<const_std::byte,_18446744073709551615UL>,_6UL>::operator[]
                     ((array<std::span<const_std::byte,_18446744073709551615UL>,_6UL> *)
                      unodb::test::test_values,1);
  v_00._M_ptr = pvVar2->_M_ptr;
  v_00._M_extent._M_extent_value = (pvVar2->_M_extent)._M_extent_value;
  unodb::test::
  tree_verifier<unodb::mutex_db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>_>
  ::insert<unsigned_long>
            ((tree_verifier<unodb::mutex_db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>_>
              *)&db,0xaa20,v_00,false);
  pvVar2 = std::array<std::span<const_std::byte,_18446744073709551615UL>,_6UL>::operator[]
                     ((array<std::span<const_std::byte,_18446744073709551615UL>,_6UL> *)
                      unodb::test::test_values,2);
  v_01._M_ptr = pvVar2->_M_ptr;
  v_01._M_extent._M_extent_value = (pvVar2->_M_extent)._M_extent_value;
  unodb::test::
  tree_verifier<unodb::mutex_db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>_>
  ::insert<unsigned_long>
            ((tree_verifier<unodb::mutex_db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>_>
              *)&db,0xaa30,v_01,false);
  it.keybuf_.off._7_1_ = 0;
  unodb::
  mutex_db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>
  ::test_only_iterator
            ((iterator *)local_300,
             (mutex_db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>
              *)k0);
  kVar4 = unodb::test::
          tree_verifier<unodb::mutex_db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>_>
          ::coerce_key<unsigned_long>
                    ((tree_verifier<unodb::mutex_db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>_>
                      *)&db,0xaa10);
  gtest_ar_.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl =
       (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
        )kVar4._M_ptr;
  unodb::detail::basic_art_key<std::span<const_std::byte,_18446744073709551615UL>_>::basic_art_key
            ((basic_art_key<std::span<const_std::byte,_18446744073709551615UL>_> *)&local_310.key,
             kVar4);
  unodb::
  db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>
  ::iterator::seek((iterator *)local_300,(art_key_type)local_310,(bool *)((long)&it.keybuf_.off + 7)
                   ,true);
  local_331 = unodb::
              db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>
              ::iterator::valid((iterator *)local_300);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_330,&local_331,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_330);
  if (!bVar1) {
    testing::Message::Message(&local_340);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar__1.message_,(internal *)local_330,(AssertionResult *)"it.valid()"
               ,"false","true",in_R9);
    pcVar3 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::c_str
                       ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        &gtest_ar__1.message_);
    testing::internal::AssertHelper::AssertHelper
              (&local_348,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/laurynas-biveinis[P]unodb/test/test_art_iter.cpp"
               ,0x225,pcVar3);
    testing::internal::AssertHelper::operator=(&local_348,&local_340);
    testing::internal::AssertHelper::~AssertHelper(&local_348);
    std::__cxx11::string::~string((string *)&gtest_ar__1.message_);
    testing::Message::~Message(&local_340);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_330);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_378,(bool *)((long)&it.keybuf_.off + 7),(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_378);
  if (!bVar1) {
    testing::Message::Message(&local_380);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar.message_,(internal *)local_378,(AssertionResult *)0x30452b,
               "false","true",in_R9);
    pcVar3 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::c_str
                       ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        &gtest_ar.message_);
    testing::internal::AssertHelper::AssertHelper
              (&local_388,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/laurynas-biveinis[P]unodb/test/test_art_iter.cpp"
               ,0x226,pcVar3);
    testing::internal::AssertHelper::operator=(&local_388,&local_380);
    testing::internal::AssertHelper::~AssertHelper(&local_388);
    std::__cxx11::string::~string((string *)&gtest_ar.message_);
    testing::Message::~Message(&local_380);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_378);
  local_3d0 = unodb::
              db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>
              ::iterator::get_key((iterator *)local_300);
  akey._M_extent = local_3d0._M_extent._M_extent_value;
  akey._M_ptr = (pointer)akey._M_extent._M_extent_value;
  local_3c0 = decode((anon_unknown_dwarf_d5c8 *)local_3d0._M_ptr,akey);
  testing::internal::EqHelper::Compare<unsigned_long,_unsigned_long,_nullptr>
            ((EqHelper *)local_3b8,"(decode(it.get_key()))","(k0)",&local_3c0,&k1);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_3b8);
  if (!bVar1) {
    testing::Message::Message(&local_3d8);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_3b8);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar__2.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/laurynas-biveinis[P]unodb/test/test_art_iter.cpp"
               ,0x227,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar__2.message_,&local_3d8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar__2.message_);
    testing::Message::~Message(&local_3d8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_3b8);
  local_408 = unodb::
              db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>
              ::iterator::get_val((iterator *)local_300);
  pvVar2 = std::array<std::span<const_std::byte,_18446744073709551615UL>,_6UL>::operator[]
                     ((array<std::span<const_std::byte,_18446744073709551615UL>,_6UL> *)
                      unodb::test::test_values,0);
  local_3f1 = std::ranges::__equal_fn::
              operator()<std::span<const_std::byte,_18446744073709551615UL>,_const_std::span<const_std::byte,_18446744073709551615UL>_&,_std::ranges::equal_to,_std::identity,_std::identity>
                        ((__equal_fn *)&std::ranges::equal,&local_408,pvVar2);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_3f0,&local_3f1,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_3f0);
  if (!bVar1) {
    testing::Message::Message(local_418);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_440,(internal *)local_3f0,
               (AssertionResult *)"std::ranges::equal(it.get_val(), unodb::test::test_values[0])",
               "false","true",in_R9);
    pcVar3 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::c_str
                       ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        local_440);
    testing::internal::AssertHelper::AssertHelper
              (&local_420,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/laurynas-biveinis[P]unodb/test/test_art_iter.cpp"
               ,0x229,pcVar3);
    testing::internal::AssertHelper::operator=(&local_420,local_418);
    testing::internal::AssertHelper::~AssertHelper(&local_420);
    std::__cxx11::string::~string((string *)local_440);
    testing::Message::~Message(local_418);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_3f0);
  unodb::
  db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>
  ::iterator::~iterator((iterator *)local_300);
  it_1.keybuf_.off._7_1_ = 0;
  unodb::
  mutex_db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>
  ::test_only_iterator
            ((iterator *)local_5b8,
             (mutex_db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>
              *)k0);
  kVar4 = unodb::test::
          tree_verifier<unodb::mutex_db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>_>
          ::coerce_key<unsigned_long>
                    ((tree_verifier<unodb::mutex_db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>_>
                      *)&db,0xaa20);
  gtest_ar__3.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl =
       (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
        )kVar4._M_ptr;
  unodb::detail::basic_art_key<std::span<const_std::byte,_18446744073709551615UL>_>::basic_art_key
            ((basic_art_key<std::span<const_std::byte,_18446744073709551615UL>_> *)&local_5c8.key,
             kVar4);
  unodb::
  db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>
  ::iterator::seek((iterator *)local_5b8,(art_key_type)local_5c8,
                   (bool *)((long)&it_1.keybuf_.off + 7),true);
  local_5e9 = unodb::
              db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>
              ::iterator::valid((iterator *)local_5b8);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_5e8,&local_5e9,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_5e8);
  if (!bVar1) {
    testing::Message::Message(&local_5f8);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar__4.message_,(internal *)local_5e8,(AssertionResult *)"it.valid()"
               ,"false","true",in_R9);
    pcVar3 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::c_str
                       ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        &gtest_ar__4.message_);
    testing::internal::AssertHelper::AssertHelper
              (&local_600,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/laurynas-biveinis[P]unodb/test/test_art_iter.cpp"
               ,0x230,pcVar3);
    testing::internal::AssertHelper::operator=(&local_600,&local_5f8);
    testing::internal::AssertHelper::~AssertHelper(&local_600);
    std::__cxx11::string::~string((string *)&gtest_ar__4.message_);
    testing::Message::~Message(&local_5f8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_5e8);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_630,(bool *)((long)&it_1.keybuf_.off + 7),(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_630);
  if (!bVar1) {
    testing::Message::Message(&local_638);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar_1.message_,(internal *)local_630,(AssertionResult *)0x30452b,
               "false","true",in_R9);
    pcVar3 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::c_str
                       ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        &gtest_ar_1.message_);
    testing::internal::AssertHelper::AssertHelper
              (&local_640,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/laurynas-biveinis[P]unodb/test/test_art_iter.cpp"
               ,0x231,pcVar3);
    testing::internal::AssertHelper::operator=(&local_640,&local_638);
    testing::internal::AssertHelper::~AssertHelper(&local_640);
    std::__cxx11::string::~string((string *)&gtest_ar_1.message_);
    testing::Message::~Message(&local_638);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_630);
  local_688 = unodb::
              db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>
              ::iterator::get_key((iterator *)local_5b8);
  akey_00._M_extent = local_688._M_extent._M_extent_value;
  akey_00._M_ptr = (pointer)akey_00._M_extent._M_extent_value;
  local_678 = decode((anon_unknown_dwarf_d5c8 *)local_688._M_ptr,akey_00);
  testing::internal::EqHelper::Compare<unsigned_long,_unsigned_long,_nullptr>
            ((EqHelper *)local_670,"(decode(it.get_key()))","(k1)",&local_678,&k2);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_670);
  if (!bVar1) {
    testing::Message::Message(&local_690);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_670);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar__5.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/laurynas-biveinis[P]unodb/test/test_art_iter.cpp"
               ,0x232,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar__5.message_,&local_690);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar__5.message_);
    testing::Message::~Message(&local_690);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_670);
  local_6c0 = unodb::
              db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>
              ::iterator::get_val((iterator *)local_5b8);
  pvVar2 = std::array<std::span<const_std::byte,_18446744073709551615UL>,_6UL>::operator[]
                     ((array<std::span<const_std::byte,_18446744073709551615UL>,_6UL> *)
                      unodb::test::test_values,1);
  local_6a9 = std::ranges::__equal_fn::
              operator()<std::span<const_std::byte,_18446744073709551615UL>,_const_std::span<const_std::byte,_18446744073709551615UL>_&,_std::ranges::equal_to,_std::identity,_std::identity>
                        ((__equal_fn *)&std::ranges::equal,&local_6c0,pvVar2);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_6a8,&local_6a9,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_6a8);
  if (!bVar1) {
    testing::Message::Message(local_6d0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_6f8,(internal *)local_6a8,
               (AssertionResult *)"std::ranges::equal(it.get_val(), unodb::test::test_values[1])",
               "false","true",in_R9);
    pcVar3 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::c_str
                       ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        local_6f8);
    testing::internal::AssertHelper::AssertHelper
              (&local_6d8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/laurynas-biveinis[P]unodb/test/test_art_iter.cpp"
               ,0x234,pcVar3);
    testing::internal::AssertHelper::operator=(&local_6d8,local_6d0);
    testing::internal::AssertHelper::~AssertHelper(&local_6d8);
    std::__cxx11::string::~string((string *)local_6f8);
    testing::Message::~Message(local_6d0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_6a8);
  unodb::
  db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>
  ::iterator::~iterator((iterator *)local_5b8);
  it_2.keybuf_.off._7_1_ = 0;
  unodb::
  mutex_db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>
  ::test_only_iterator
            ((iterator *)local_870,
             (mutex_db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>
              *)k0);
  kVar4 = unodb::test::
          tree_verifier<unodb::mutex_db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>_>
          ::coerce_key<unsigned_long>
                    ((tree_verifier<unodb::mutex_db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>_>
                      *)&db,0xaa30);
  gtest_ar__6.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl =
       (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
        )kVar4._M_ptr;
  unodb::detail::basic_art_key<std::span<const_std::byte,_18446744073709551615UL>_>::basic_art_key
            ((basic_art_key<std::span<const_std::byte,_18446744073709551615UL>_> *)&local_880.key,
             kVar4);
  unodb::
  db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>
  ::iterator::seek((iterator *)local_870,(art_key_type)local_880,
                   (bool *)((long)&it_2.keybuf_.off + 7),true);
  local_8a1 = unodb::
              db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>
              ::iterator::valid((iterator *)local_870);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_8a0,&local_8a1,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_8a0);
  if (!bVar1) {
    testing::Message::Message(&local_8b0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar__7.message_,(internal *)local_8a0,(AssertionResult *)"it.valid()"
               ,"false","true",in_R9);
    pcVar3 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::c_str
                       ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        &gtest_ar__7.message_);
    testing::internal::AssertHelper::AssertHelper
              (&local_8b8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/laurynas-biveinis[P]unodb/test/test_art_iter.cpp"
               ,0x23b,pcVar3);
    testing::internal::AssertHelper::operator=(&local_8b8,&local_8b0);
    testing::internal::AssertHelper::~AssertHelper(&local_8b8);
    std::__cxx11::string::~string((string *)&gtest_ar__7.message_);
    testing::Message::~Message(&local_8b0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_8a0);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_8e8,(bool *)((long)&it_2.keybuf_.off + 7),(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_8e8);
  if (!bVar1) {
    testing::Message::Message(&local_8f0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar_2.message_,(internal *)local_8e8,(AssertionResult *)0x30452b,
               "false","true",in_R9);
    pcVar3 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::c_str
                       ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        &gtest_ar_2.message_);
    testing::internal::AssertHelper::AssertHelper
              (&local_8f8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/laurynas-biveinis[P]unodb/test/test_art_iter.cpp"
               ,0x23c,pcVar3);
    testing::internal::AssertHelper::operator=(&local_8f8,&local_8f0);
    testing::internal::AssertHelper::~AssertHelper(&local_8f8);
    std::__cxx11::string::~string((string *)&gtest_ar_2.message_);
    testing::Message::~Message(&local_8f0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_8e8);
  local_940 = unodb::
              db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>
              ::iterator::get_key((iterator *)local_870);
  akey_01._M_extent = local_940._M_extent._M_extent_value;
  akey_01._M_ptr = (pointer)akey_01._M_extent._M_extent_value;
  local_930 = decode((anon_unknown_dwarf_d5c8 *)local_940._M_ptr,akey_01);
  testing::internal::EqHelper::Compare<unsigned_long,_unsigned_long,_nullptr>
            ((EqHelper *)local_928,"(decode(it.get_key()))","(k2)",&local_930,&local_140);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_928);
  if (!bVar1) {
    testing::Message::Message(&local_948);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_928);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar__8.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/laurynas-biveinis[P]unodb/test/test_art_iter.cpp"
               ,0x23d,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar__8.message_,&local_948);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar__8.message_);
    testing::Message::~Message(&local_948);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_928);
  local_978 = unodb::
              db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>
              ::iterator::get_val((iterator *)local_870);
  pvVar2 = std::array<std::span<const_std::byte,_18446744073709551615UL>,_6UL>::operator[]
                     ((array<std::span<const_std::byte,_18446744073709551615UL>,_6UL> *)
                      unodb::test::test_values,2);
  local_961 = std::ranges::__equal_fn::
              operator()<std::span<const_std::byte,_18446744073709551615UL>,_const_std::span<const_std::byte,_18446744073709551615UL>_&,_std::ranges::equal_to,_std::identity,_std::identity>
                        ((__equal_fn *)&std::ranges::equal,&local_978,pvVar2);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_960,&local_961,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_960);
  if (!bVar1) {
    testing::Message::Message(local_988);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_9b0,(internal *)local_960,
               (AssertionResult *)"std::ranges::equal(it.get_val(), unodb::test::test_values[2])",
               "false","true",in_R9);
    pcVar3 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::c_str
                       ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        local_9b0);
    testing::internal::AssertHelper::AssertHelper
              (&local_990,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/laurynas-biveinis[P]unodb/test/test_art_iter.cpp"
               ,0x23f,pcVar3);
    testing::internal::AssertHelper::operator=(&local_990,local_988);
    testing::internal::AssertHelper::~AssertHelper(&local_990);
    std::__cxx11::string::~string((string *)local_9b0);
    testing::Message::~Message(local_988);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_960);
  unodb::
  db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>
  ::iterator::~iterator((iterator *)local_870);
  it_3.keybuf_.off._7_1_ = 0;
  unodb::
  mutex_db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>
  ::test_only_iterator
            ((iterator *)local_b28,
             (mutex_db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>
              *)k0);
  kVar4 = unodb::test::
          tree_verifier<unodb::mutex_db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>_>
          ::coerce_key<unsigned_long>
                    ((tree_verifier<unodb::mutex_db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>_>
                      *)&db,0xaa10);
  gtest_ar__9.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl =
       (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
        )kVar4._M_ptr;
  unodb::detail::basic_art_key<std::span<const_std::byte,_18446744073709551615UL>_>::basic_art_key
            ((basic_art_key<std::span<const_std::byte,_18446744073709551615UL>_> *)&local_b38.key,
             kVar4);
  unodb::
  db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>
  ::iterator::seek((iterator *)local_b28,(art_key_type)local_b38,
                   (bool *)((long)&it_3.keybuf_.off + 7),false);
  local_b59 = unodb::
              db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>
              ::iterator::valid((iterator *)local_b28);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_b58,&local_b59,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_b58);
  if (!bVar1) {
    testing::Message::Message(&local_b68);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar__10.message_,(internal *)local_b58,
               (AssertionResult *)"it.valid()","false","true",in_R9);
    pcVar3 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::c_str
                       ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        &gtest_ar__10.message_);
    testing::internal::AssertHelper::AssertHelper
              (&local_b70,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/laurynas-biveinis[P]unodb/test/test_art_iter.cpp"
               ,0x248,pcVar3);
    testing::internal::AssertHelper::operator=(&local_b70,&local_b68);
    testing::internal::AssertHelper::~AssertHelper(&local_b70);
    std::__cxx11::string::~string((string *)&gtest_ar__10.message_);
    testing::Message::~Message(&local_b68);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_b58);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_ba0,(bool *)((long)&it_3.keybuf_.off + 7),(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_ba0);
  if (!bVar1) {
    testing::Message::Message(&local_ba8);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar_3.message_,(internal *)local_ba0,(AssertionResult *)0x30452b,
               "false","true",in_R9);
    pcVar3 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::c_str
                       ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        &gtest_ar_3.message_);
    testing::internal::AssertHelper::AssertHelper
              (&local_bb0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/laurynas-biveinis[P]unodb/test/test_art_iter.cpp"
               ,0x249,pcVar3);
    testing::internal::AssertHelper::operator=(&local_bb0,&local_ba8);
    testing::internal::AssertHelper::~AssertHelper(&local_bb0);
    std::__cxx11::string::~string((string *)&gtest_ar_3.message_);
    testing::Message::~Message(&local_ba8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_ba0);
  local_bf8 = unodb::
              db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>
              ::iterator::get_key((iterator *)local_b28);
  akey_02._M_extent = local_bf8._M_extent._M_extent_value;
  akey_02._M_ptr = (pointer)akey_02._M_extent._M_extent_value;
  local_be8 = decode((anon_unknown_dwarf_d5c8 *)local_bf8._M_ptr,akey_02);
  testing::internal::EqHelper::Compare<unsigned_long,_unsigned_long,_nullptr>
            ((EqHelper *)local_be0,"(decode(it.get_key()))","(k0)",&local_be8,&k1);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_be0);
  if (!bVar1) {
    testing::Message::Message(&local_c00);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_be0);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar__11.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/laurynas-biveinis[P]unodb/test/test_art_iter.cpp"
               ,0x24a,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar__11.message_,&local_c00);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar__11.message_);
    testing::Message::~Message(&local_c00);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_be0);
  local_c30 = unodb::
              db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>
              ::iterator::get_val((iterator *)local_b28);
  pvVar2 = std::array<std::span<const_std::byte,_18446744073709551615UL>,_6UL>::operator[]
                     ((array<std::span<const_std::byte,_18446744073709551615UL>,_6UL> *)
                      unodb::test::test_values,0);
  local_c19 = std::ranges::__equal_fn::
              operator()<std::span<const_std::byte,_18446744073709551615UL>,_const_std::span<const_std::byte,_18446744073709551615UL>_&,_std::ranges::equal_to,_std::identity,_std::identity>
                        ((__equal_fn *)&std::ranges::equal,&local_c30,pvVar2);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_c18,&local_c19,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_c18);
  if (!bVar1) {
    testing::Message::Message(local_c40);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_c68,(internal *)local_c18,
               (AssertionResult *)"std::ranges::equal(it.get_val(), unodb::test::test_values[0])",
               "false","true",in_R9);
    pcVar3 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::c_str
                       ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        local_c68);
    testing::internal::AssertHelper::AssertHelper
              (&local_c48,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/laurynas-biveinis[P]unodb/test/test_art_iter.cpp"
               ,0x24c,pcVar3);
    testing::internal::AssertHelper::operator=(&local_c48,local_c40);
    testing::internal::AssertHelper::~AssertHelper(&local_c48);
    std::__cxx11::string::~string((string *)local_c68);
    testing::Message::~Message(local_c40);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_c18);
  unodb::
  db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>
  ::iterator::~iterator((iterator *)local_b28);
  it_4.keybuf_.off._7_1_ = 0;
  unodb::
  mutex_db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>
  ::test_only_iterator
            ((iterator *)local_de0,
             (mutex_db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>
              *)k0);
  kVar4 = unodb::test::
          tree_verifier<unodb::mutex_db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>_>
          ::coerce_key<unsigned_long>
                    ((tree_verifier<unodb::mutex_db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>_>
                      *)&db,0xaa20);
  gtest_ar__12.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl =
       (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
        )kVar4._M_ptr;
  unodb::detail::basic_art_key<std::span<const_std::byte,_18446744073709551615UL>_>::basic_art_key
            ((basic_art_key<std::span<const_std::byte,_18446744073709551615UL>_> *)&local_df0.key,
             kVar4);
  unodb::
  db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>
  ::iterator::seek((iterator *)local_de0,(art_key_type)local_df0,
                   (bool *)((long)&it_4.keybuf_.off + 7),false);
  local_e11 = unodb::
              db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>
              ::iterator::valid((iterator *)local_de0);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_e10,&local_e11,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_e10);
  if (!bVar1) {
    testing::Message::Message(&local_e20);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar__13.message_,(internal *)local_e10,
               (AssertionResult *)"it.valid()","false","true",in_R9);
    pcVar3 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::c_str
                       ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        &gtest_ar__13.message_);
    testing::internal::AssertHelper::AssertHelper
              (&local_e28,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/laurynas-biveinis[P]unodb/test/test_art_iter.cpp"
               ,0x253,pcVar3);
    testing::internal::AssertHelper::operator=(&local_e28,&local_e20);
    testing::internal::AssertHelper::~AssertHelper(&local_e28);
    std::__cxx11::string::~string((string *)&gtest_ar__13.message_);
    testing::Message::~Message(&local_e20);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_e10);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_e58,(bool *)((long)&it_4.keybuf_.off + 7),(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_e58);
  if (!bVar1) {
    testing::Message::Message(&local_e60);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar_4.message_,(internal *)local_e58,(AssertionResult *)0x30452b,
               "false","true",in_R9);
    pcVar3 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::c_str
                       ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        &gtest_ar_4.message_);
    testing::internal::AssertHelper::AssertHelper
              (&local_e68,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/laurynas-biveinis[P]unodb/test/test_art_iter.cpp"
               ,0x254,pcVar3);
    testing::internal::AssertHelper::operator=(&local_e68,&local_e60);
    testing::internal::AssertHelper::~AssertHelper(&local_e68);
    std::__cxx11::string::~string((string *)&gtest_ar_4.message_);
    testing::Message::~Message(&local_e60);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_e58);
  local_eb0 = unodb::
              db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>
              ::iterator::get_key((iterator *)local_de0);
  akey_03._M_extent = local_eb0._M_extent._M_extent_value;
  akey_03._M_ptr = (pointer)akey_03._M_extent._M_extent_value;
  local_ea0 = decode((anon_unknown_dwarf_d5c8 *)local_eb0._M_ptr,akey_03);
  testing::internal::EqHelper::Compare<unsigned_long,_unsigned_long,_nullptr>
            ((EqHelper *)local_e98,"(decode(it.get_key()))","(k1)",&local_ea0,&k2);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_e98);
  if (!bVar1) {
    testing::Message::Message(&local_eb8);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_e98);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar__14.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/laurynas-biveinis[P]unodb/test/test_art_iter.cpp"
               ,0x255,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar__14.message_,&local_eb8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar__14.message_);
    testing::Message::~Message(&local_eb8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_e98);
  local_ee8 = unodb::
              db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>
              ::iterator::get_val((iterator *)local_de0);
  pvVar2 = std::array<std::span<const_std::byte,_18446744073709551615UL>,_6UL>::operator[]
                     ((array<std::span<const_std::byte,_18446744073709551615UL>,_6UL> *)
                      unodb::test::test_values,1);
  local_ed1 = std::ranges::__equal_fn::
              operator()<std::span<const_std::byte,_18446744073709551615UL>,_const_std::span<const_std::byte,_18446744073709551615UL>_&,_std::ranges::equal_to,_std::identity,_std::identity>
                        ((__equal_fn *)&std::ranges::equal,&local_ee8,pvVar2);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_ed0,&local_ed1,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_ed0);
  if (!bVar1) {
    testing::Message::Message(local_ef8);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_f20,(internal *)local_ed0,
               (AssertionResult *)"std::ranges::equal(it.get_val(), unodb::test::test_values[1])",
               "false","true",in_R9);
    pcVar3 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::c_str
                       ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        local_f20);
    testing::internal::AssertHelper::AssertHelper
              (&local_f00,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/laurynas-biveinis[P]unodb/test/test_art_iter.cpp"
               ,599,pcVar3);
    testing::internal::AssertHelper::operator=(&local_f00,local_ef8);
    testing::internal::AssertHelper::~AssertHelper(&local_f00);
    std::__cxx11::string::~string((string *)local_f20);
    testing::Message::~Message(local_ef8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_ed0);
  unodb::
  db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>
  ::iterator::~iterator((iterator *)local_de0);
  it_5.keybuf_.off._7_1_ = 0;
  unodb::
  mutex_db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>
  ::test_only_iterator
            ((iterator *)local_1098,
             (mutex_db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>
              *)k0);
  kVar4 = unodb::test::
          tree_verifier<unodb::mutex_db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>_>
          ::coerce_key<unsigned_long>
                    ((tree_verifier<unodb::mutex_db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>_>
                      *)&db,0xaa30);
  gtest_ar__15.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl =
       (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
        )kVar4._M_ptr;
  unodb::detail::basic_art_key<std::span<const_std::byte,_18446744073709551615UL>_>::basic_art_key
            ((basic_art_key<std::span<const_std::byte,_18446744073709551615UL>_> *)&local_10a8.key,
             kVar4);
  unodb::
  db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>
  ::iterator::seek((iterator *)local_1098,(art_key_type)local_10a8,
                   (bool *)((long)&it_5.keybuf_.off + 7),false);
  local_10c9 = unodb::
               db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>
               ::iterator::valid((iterator *)local_1098);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_10c8,&local_10c9,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_10c8);
  if (!bVar1) {
    testing::Message::Message(&local_10d8);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar__16.message_,(internal *)local_10c8,
               (AssertionResult *)"it.valid()","false","true",in_R9);
    pcVar3 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::c_str
                       ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        &gtest_ar__16.message_);
    testing::internal::AssertHelper::AssertHelper
              (&local_10e0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/laurynas-biveinis[P]unodb/test/test_art_iter.cpp"
               ,0x25e,pcVar3);
    testing::internal::AssertHelper::operator=(&local_10e0,&local_10d8);
    testing::internal::AssertHelper::~AssertHelper(&local_10e0);
    std::__cxx11::string::~string((string *)&gtest_ar__16.message_);
    testing::Message::~Message(&local_10d8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_10c8);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_1110,(bool *)((long)&it_5.keybuf_.off + 7),(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1110);
  if (!bVar1) {
    testing::Message::Message(&local_1118);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar_5.message_,(internal *)local_1110,(AssertionResult *)0x30452b,
               "false","true",in_R9);
    pcVar3 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::c_str
                       ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        &gtest_ar_5.message_);
    testing::internal::AssertHelper::AssertHelper
              (&local_1120,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/laurynas-biveinis[P]unodb/test/test_art_iter.cpp"
               ,0x25f,pcVar3);
    testing::internal::AssertHelper::operator=(&local_1120,&local_1118);
    testing::internal::AssertHelper::~AssertHelper(&local_1120);
    std::__cxx11::string::~string((string *)&gtest_ar_5.message_);
    testing::Message::~Message(&local_1118);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_1110);
  local_1168 = unodb::
               db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>
               ::iterator::get_key((iterator *)local_1098);
  akey_04._M_extent = local_1168._M_extent._M_extent_value;
  akey_04._M_ptr = (pointer)akey_04._M_extent._M_extent_value;
  local_1158 = decode((anon_unknown_dwarf_d5c8 *)local_1168._M_ptr,akey_04);
  testing::internal::EqHelper::Compare<unsigned_long,_unsigned_long,_nullptr>
            ((EqHelper *)local_1150,"(decode(it.get_key()))","(k2)",&local_1158,&local_140);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1150);
  if (!bVar1) {
    testing::Message::Message(&local_1170);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_1150);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar__17.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/laurynas-biveinis[P]unodb/test/test_art_iter.cpp"
               ,0x260,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar__17.message_,&local_1170);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar__17.message_);
    testing::Message::~Message(&local_1170);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_1150);
  local_11a0 = unodb::
               db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>
               ::iterator::get_val((iterator *)local_1098);
  pvVar2 = std::array<std::span<const_std::byte,_18446744073709551615UL>,_6UL>::operator[]
                     ((array<std::span<const_std::byte,_18446744073709551615UL>,_6UL> *)
                      unodb::test::test_values,2);
  local_1189 = std::ranges::__equal_fn::
               operator()<std::span<const_std::byte,_18446744073709551615UL>,_const_std::span<const_std::byte,_18446744073709551615UL>_&,_std::ranges::equal_to,_std::identity,_std::identity>
                         ((__equal_fn *)&std::ranges::equal,&local_11a0,pvVar2);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_1188,&local_1189,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1188);
  if (!bVar1) {
    testing::Message::Message(local_11b0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_11d8,(internal *)local_1188,
               (AssertionResult *)"std::ranges::equal(it.get_val(), unodb::test::test_values[2])",
               "false","true",in_R9);
    pcVar3 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::c_str
                       ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        local_11d8);
    testing::internal::AssertHelper::AssertHelper
              (&local_11b8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/laurynas-biveinis[P]unodb/test/test_art_iter.cpp"
               ,0x262,pcVar3);
    testing::internal::AssertHelper::operator=(&local_11b8,local_11b0);
    testing::internal::AssertHelper::~AssertHelper(&local_11b8);
    std::__cxx11::string::~string((string *)local_11d8);
    testing::Message::~Message(local_11b0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_1188);
  unodb::
  db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>
  ::iterator::~iterator((iterator *)local_1098);
  it_6.keybuf_.off._7_1_ = 1;
  unodb::
  mutex_db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>
  ::test_only_iterator
            ((iterator *)local_1350,
             (mutex_db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>
              *)k0);
  kVar4 = unodb::test::
          tree_verifier<unodb::mutex_db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>_>
          ::coerce_key<int>((tree_verifier<unodb::mutex_db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>_>
                             *)&db,0);
  gtest_ar__18.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl =
       (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
        )kVar4._M_ptr;
  unodb::detail::basic_art_key<std::span<const_std::byte,_18446744073709551615UL>_>::basic_art_key
            ((basic_art_key<std::span<const_std::byte,_18446744073709551615UL>_> *)&local_1360.key,
             kVar4);
  unodb::
  db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>
  ::iterator::seek((iterator *)local_1350,(art_key_type)local_1360,
                   (bool *)((long)&it_6.keybuf_.off + 7),true);
  local_1381 = unodb::
               db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>
               ::iterator::valid((iterator *)local_1350);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_1380,&local_1381,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1380);
  if (!bVar1) {
    testing::Message::Message(&local_1390);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar__19.message_,(internal *)local_1380,
               (AssertionResult *)"it.valid()","false","true",in_R9);
    pcVar3 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::c_str
                       ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        &gtest_ar__19.message_);
    testing::internal::AssertHelper::AssertHelper
              (&local_1398,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/laurynas-biveinis[P]unodb/test/test_art_iter.cpp"
               ,0x271,pcVar3);
    testing::internal::AssertHelper::operator=(&local_1398,&local_1390);
    testing::internal::AssertHelper::~AssertHelper(&local_1398);
    std::__cxx11::string::~string((string *)&gtest_ar__19.message_);
    testing::Message::~Message(&local_1390);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_1380);
  local_13c9 = (bool)(~it_6.keybuf_.off._7_1_ & 1);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_13c8,&local_13c9,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_13c8);
  if (!bVar1) {
    testing::Message::Message(&local_13d8);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar_6.message_,(internal *)local_13c8,(AssertionResult *)0x30452b,
               "true","false",in_R9);
    pcVar3 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::c_str
                       ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        &gtest_ar_6.message_);
    testing::internal::AssertHelper::AssertHelper
              (&local_13e0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/laurynas-biveinis[P]unodb/test/test_art_iter.cpp"
               ,0x272,pcVar3);
    testing::internal::AssertHelper::operator=(&local_13e0,&local_13d8);
    testing::internal::AssertHelper::~AssertHelper(&local_13e0);
    std::__cxx11::string::~string((string *)&gtest_ar_6.message_);
    testing::Message::~Message(&local_13d8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_13c8);
  local_1428 = unodb::
               db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>
               ::iterator::get_key((iterator *)local_1350);
  akey_05._M_extent = local_1428._M_extent._M_extent_value;
  akey_05._M_ptr = (pointer)akey_05._M_extent._M_extent_value;
  local_1418 = decode((anon_unknown_dwarf_d5c8 *)local_1428._M_ptr,akey_05);
  testing::internal::EqHelper::Compare<unsigned_long,_unsigned_long,_nullptr>
            ((EqHelper *)local_1410,"(decode(it.get_key()))","(k0)",&local_1418,&k1);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1410);
  if (!bVar1) {
    testing::Message::Message(&local_1430);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_1410);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar__20.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/laurynas-biveinis[P]unodb/test/test_art_iter.cpp"
               ,0x273,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar__20.message_,&local_1430);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar__20.message_);
    testing::Message::~Message(&local_1430);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_1410);
  local_1460 = unodb::
               db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>
               ::iterator::get_val((iterator *)local_1350);
  pvVar2 = std::array<std::span<const_std::byte,_18446744073709551615UL>,_6UL>::operator[]
                     ((array<std::span<const_std::byte,_18446744073709551615UL>,_6UL> *)
                      unodb::test::test_values,0);
  local_1449 = std::ranges::__equal_fn::
               operator()<std::span<const_std::byte,_18446744073709551615UL>,_const_std::span<const_std::byte,_18446744073709551615UL>_&,_std::ranges::equal_to,_std::identity,_std::identity>
                         ((__equal_fn *)&std::ranges::equal,&local_1460,pvVar2);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_1448,&local_1449,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1448);
  if (!bVar1) {
    testing::Message::Message(local_1470);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_1498,(internal *)local_1448,
               (AssertionResult *)"std::ranges::equal(it.get_val(), unodb::test::test_values[0])",
               "false","true",in_R9);
    pcVar3 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::c_str
                       ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        local_1498);
    testing::internal::AssertHelper::AssertHelper
              (&local_1478,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/laurynas-biveinis[P]unodb/test/test_art_iter.cpp"
               ,0x275,pcVar3);
    testing::internal::AssertHelper::operator=(&local_1478,local_1470);
    testing::internal::AssertHelper::~AssertHelper(&local_1478);
    std::__cxx11::string::~string((string *)local_1498);
    testing::Message::~Message(local_1470);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_1448);
  unodb::
  db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>
  ::iterator::~iterator((iterator *)local_1350);
  it_7.keybuf_.off._7_1_ = 1;
  unodb::
  mutex_db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>
  ::test_only_iterator
            ((iterator *)local_1610,
             (mutex_db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>
              *)k0);
  kVar4 = unodb::test::
          tree_verifier<unodb::mutex_db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>_>
          ::coerce_key<int>((tree_verifier<unodb::mutex_db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>_>
                             *)&db,0xffff);
  gtest_ar__21.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl =
       (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
        )kVar4._M_ptr;
  unodb::detail::basic_art_key<std::span<const_std::byte,_18446744073709551615UL>_>::basic_art_key
            ((basic_art_key<std::span<const_std::byte,_18446744073709551615UL>_> *)&local_1620.key,
             kVar4);
  unodb::
  db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>
  ::iterator::seek((iterator *)local_1610,(art_key_type)local_1620,
                   (bool *)((long)&it_7.keybuf_.off + 7),true);
  local_1641 = unodb::
               db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>
               ::iterator::valid((iterator *)local_1610);
  local_1641 = !local_1641;
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_1640,&local_1641,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1640);
  if (!bVar1) {
    testing::Message::Message(&local_1650);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar__22.message_,(internal *)local_1640,
               (AssertionResult *)"it.valid()","true","false",in_R9);
    pcVar3 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::c_str
                       ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        &gtest_ar__22.message_);
    testing::internal::AssertHelper::AssertHelper
              (&local_1658,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/laurynas-biveinis[P]unodb/test/test_art_iter.cpp"
               ,0x281,pcVar3);
    testing::internal::AssertHelper::operator=(&local_1658,&local_1650);
    testing::internal::AssertHelper::~AssertHelper(&local_1658);
    std::__cxx11::string::~string((string *)&gtest_ar__22.message_);
    testing::Message::~Message(&local_1650);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_1640);
  local_1689 = (bool)(~it_7.keybuf_.off._7_1_ & 1);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_1688,&local_1689,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1688);
  if (!bVar1) {
    testing::Message::Message(&local_1698);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_16c0,(internal *)local_1688,(AssertionResult *)0x30452b,"true",
               "false",in_R9);
    pcVar3 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::c_str
                       ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        local_16c0);
    testing::internal::AssertHelper::AssertHelper
              (&local_16a0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/laurynas-biveinis[P]unodb/test/test_art_iter.cpp"
               ,0x282,pcVar3);
    testing::internal::AssertHelper::operator=(&local_16a0,&local_1698);
    testing::internal::AssertHelper::~AssertHelper(&local_16a0);
    std::__cxx11::string::~string((string *)local_16c0);
    testing::Message::~Message(&local_1698);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_1688);
  unodb::
  db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>
  ::iterator::~iterator((iterator *)local_1610);
  it_8.keybuf_.off._7_1_ = 1;
  unodb::
  mutex_db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>
  ::test_only_iterator
            ((iterator *)local_1838,
             (mutex_db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>
              *)k0);
  kVar4 = unodb::test::
          tree_verifier<unodb::mutex_db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>_>
          ::coerce_key<int>((tree_verifier<unodb::mutex_db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>_>
                             *)&db,0);
  gtest_ar__23.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl =
       (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
        )kVar4._M_ptr;
  unodb::detail::basic_art_key<std::span<const_std::byte,_18446744073709551615UL>_>::basic_art_key
            ((basic_art_key<std::span<const_std::byte,_18446744073709551615UL>_> *)&local_1848.key,
             kVar4);
  unodb::
  db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>
  ::iterator::seek((iterator *)local_1838,(art_key_type)local_1848,
                   (bool *)((long)&it_8.keybuf_.off + 7),false);
  local_1869 = unodb::
               db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>
               ::iterator::valid((iterator *)local_1838);
  local_1869 = !local_1869;
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_1868,&local_1869,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1868);
  if (!bVar1) {
    testing::Message::Message(&local_1878);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar__24.message_,(internal *)local_1868,
               (AssertionResult *)"it.valid()","true","false",in_R9);
    pcVar3 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::c_str
                       ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        &gtest_ar__24.message_);
    testing::internal::AssertHelper::AssertHelper
              (&local_1880,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/laurynas-biveinis[P]unodb/test/test_art_iter.cpp"
               ,0x28f,pcVar3);
    testing::internal::AssertHelper::operator=(&local_1880,&local_1878);
    testing::internal::AssertHelper::~AssertHelper(&local_1880);
    std::__cxx11::string::~string((string *)&gtest_ar__24.message_);
    testing::Message::~Message(&local_1878);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_1868);
  local_18b1 = (bool)(~it_8.keybuf_.off._7_1_ & 1);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_18b0,&local_18b1,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_18b0);
  if (!bVar1) {
    testing::Message::Message(&local_18c0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_18e8,(internal *)local_18b0,(AssertionResult *)0x30452b,"true",
               "false",in_R9);
    pcVar3 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::c_str
                       ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        local_18e8);
    testing::internal::AssertHelper::AssertHelper
              (&local_18c8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/laurynas-biveinis[P]unodb/test/test_art_iter.cpp"
               ,0x290,pcVar3);
    testing::internal::AssertHelper::operator=(&local_18c8,&local_18c0);
    testing::internal::AssertHelper::~AssertHelper(&local_18c8);
    std::__cxx11::string::~string((string *)local_18e8);
    testing::Message::~Message(&local_18c0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_18b0);
  unodb::
  db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>
  ::iterator::~iterator((iterator *)local_1838);
  it_9.keybuf_.off._7_1_ = 1;
  unodb::
  mutex_db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>
  ::test_only_iterator
            ((iterator *)local_1a60,
             (mutex_db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>
              *)k0);
  kVar4 = unodb::test::
          tree_verifier<unodb::mutex_db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>_>
          ::coerce_key<int>((tree_verifier<unodb::mutex_db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>_>
                             *)&db,0xffff);
  gtest_ar__25.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl =
       (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
        )kVar4._M_ptr;
  unodb::detail::basic_art_key<std::span<const_std::byte,_18446744073709551615UL>_>::basic_art_key
            ((basic_art_key<std::span<const_std::byte,_18446744073709551615UL>_> *)&local_1a70.key,
             kVar4);
  unodb::
  db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>
  ::iterator::seek((iterator *)local_1a60,(art_key_type)local_1a70,
                   (bool *)((long)&it_9.keybuf_.off + 7),false);
  local_1a91 = unodb::
               db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>
               ::iterator::valid((iterator *)local_1a60);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_1a90,&local_1a91,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1a90);
  if (!bVar1) {
    testing::Message::Message(&local_1aa0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar__26.message_,(internal *)local_1a90,
               (AssertionResult *)"it.valid()","false","true",in_R9);
    pcVar3 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::c_str
                       ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        &gtest_ar__26.message_);
    testing::internal::AssertHelper::AssertHelper
              (&local_1aa8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/laurynas-biveinis[P]unodb/test/test_art_iter.cpp"
               ,0x29c,pcVar3);
    testing::internal::AssertHelper::operator=(&local_1aa8,&local_1aa0);
    testing::internal::AssertHelper::~AssertHelper(&local_1aa8);
    std::__cxx11::string::~string((string *)&gtest_ar__26.message_);
    testing::Message::~Message(&local_1aa0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_1a90);
  local_1ad9 = (bool)(~it_9.keybuf_.off._7_1_ & 1);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_1ad8,&local_1ad9,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1ad8);
  if (!bVar1) {
    testing::Message::Message(&local_1ae8);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar_7.message_,(internal *)local_1ad8,(AssertionResult *)0x30452b,
               "true","false",in_R9);
    pcVar3 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::c_str
                       ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        &gtest_ar_7.message_);
    testing::internal::AssertHelper::AssertHelper
              (&local_1af0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/laurynas-biveinis[P]unodb/test/test_art_iter.cpp"
               ,0x29d,pcVar3);
    testing::internal::AssertHelper::operator=(&local_1af0,&local_1ae8);
    testing::internal::AssertHelper::~AssertHelper(&local_1af0);
    std::__cxx11::string::~string((string *)&gtest_ar_7.message_);
    testing::Message::~Message(&local_1ae8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_1ad8);
  local_1b38 = unodb::
               db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>
               ::iterator::get_key((iterator *)local_1a60);
  akey_06._M_extent = local_1b38._M_extent._M_extent_value;
  akey_06._M_ptr = (pointer)akey_06._M_extent._M_extent_value;
  local_1b28 = decode((anon_unknown_dwarf_d5c8 *)local_1b38._M_ptr,akey_06);
  testing::internal::EqHelper::Compare<unsigned_long,_unsigned_long,_nullptr>
            ((EqHelper *)local_1b20,"(decode(it.get_key()))","(k2)",&local_1b28,&local_140);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1b20);
  if (!bVar1) {
    testing::Message::Message(&local_1b40);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_1b20);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar__27.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/laurynas-biveinis[P]unodb/test/test_art_iter.cpp"
               ,0x29e,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar__27.message_,&local_1b40);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar__27.message_);
    testing::Message::~Message(&local_1b40);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_1b20);
  local_1b70 = unodb::
               db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>
               ::iterator::get_val((iterator *)local_1a60);
  pvVar2 = std::array<std::span<const_std::byte,_18446744073709551615UL>,_6UL>::operator[]
                     ((array<std::span<const_std::byte,_18446744073709551615UL>,_6UL> *)
                      unodb::test::test_values,2);
  local_1b59 = std::ranges::__equal_fn::
               operator()<std::span<const_std::byte,_18446744073709551615UL>,_const_std::span<const_std::byte,_18446744073709551615UL>_&,_std::ranges::equal_to,_std::identity,_std::identity>
                         ((__equal_fn *)&std::ranges::equal,&local_1b70,pvVar2);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_1b58,&local_1b59,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1b58);
  if (!bVar1) {
    testing::Message::Message(local_1b80);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar__28.message_,(internal *)local_1b58,
               (AssertionResult *)"std::ranges::equal(it.get_val(), unodb::test::test_values[2])",
               "false","true",in_R9);
    pcVar3 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::c_str
                       ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        &gtest_ar__28.message_);
    testing::internal::AssertHelper::AssertHelper
              (&local_1b88,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/laurynas-biveinis[P]unodb/test/test_art_iter.cpp"
               ,0x2a0,pcVar3);
    testing::internal::AssertHelper::operator=(&local_1b88,local_1b80);
    testing::internal::AssertHelper::~AssertHelper(&local_1b88);
    std::__cxx11::string::~string((string *)&gtest_ar__28.message_);
    testing::Message::~Message(local_1b80);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_1b58);
  unodb::
  db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>
  ::iterator::next((iterator *)local_1a60);
  local_1bb9 = unodb::
               db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>
               ::iterator::valid((iterator *)local_1a60);
  local_1bb9 = !local_1bb9;
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_1bb8,&local_1bb9,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1bb8);
  if (!bVar1) {
    testing::Message::Message(&local_1bc8);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_1bf0,(internal *)local_1bb8,(AssertionResult *)"it.valid()","true","false",
               in_R9);
    pcVar3 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::c_str
                       (&local_1bf0);
    testing::internal::AssertHelper::AssertHelper
              (&local_1bd0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/laurynas-biveinis[P]unodb/test/test_art_iter.cpp"
               ,0x2a2,pcVar3);
    testing::internal::AssertHelper::operator=(&local_1bd0,&local_1bc8);
    testing::internal::AssertHelper::~AssertHelper(&local_1bd0);
    std::__cxx11::string::~string((string *)&local_1bf0);
    testing::Message::~Message(&local_1bc8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_1bb8);
  unodb::
  db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>
  ::iterator::~iterator((iterator *)local_1a60);
  unodb::test::
  tree_verifier<unodb::mutex_db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>_>
  ::~tree_verifier((tree_verifier<unodb::mutex_db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>_>
                    *)&db);
  return;
}

Assistant:

UNODB_TYPED_TEST(ARTIteratorTest, seekThreeLeavesUnderTheRoot) {
  constexpr bool debug = false;
  using Key = typename TypeParam::key_type;
  unodb::test::tree_verifier<TypeParam> verifier;
  TypeParam& db = verifier.get_db();
  constexpr std::uint64_t k0 = 0xaa10;
  constexpr std::uint64_t k1 = 0xaa20;
  constexpr std::uint64_t k2 = 0xaa30;
  verifier.insert(k0, unodb::test::test_values[0]);
  verifier.insert(k1, unodb::test::test_values[1]);
  verifier.insert(k2, unodb::test::test_values[2]);
  if (debug) {
    std::cerr << "db state::\n";
    db.dump(std::cerr);
  }
  {    // exact match, forward traversal
    {  // exact match, forward traversal (GTE), first key.
      bool match = false;
      auto it = db.test_only_iterator();
      it.seek(unodb::detail::basic_art_key<Key>{verifier.coerce_key(k0)}, match,
              true /*fwd*/);
      UNODB_EXPECT_TRUE(it.valid());
      UNODB_EXPECT_TRUE(match);
      UNODB_EXPECT_EQ(decode(it.get_key()), k0);
      UNODB_EXPECT_TRUE(
          std::ranges::equal(it.get_val(), unodb::test::test_values[0]));
    }
    {  // exact match, forward traversal (GTE), middle key.
      bool match = false;
      auto it = db.test_only_iterator();
      it.seek(unodb::detail::basic_art_key<Key>{verifier.coerce_key(k1)}, match,
              true /*fwd*/);
      UNODB_EXPECT_TRUE(it.valid());
      UNODB_EXPECT_TRUE(match);
      UNODB_EXPECT_EQ(decode(it.get_key()), k1);
      UNODB_EXPECT_TRUE(
          std::ranges::equal(it.get_val(), unodb::test::test_values[1]));
    }
    {  // exact match, forward traversal (GTE), last key.
      bool match = false;
      auto it = db.test_only_iterator();
      it.seek(unodb::detail::basic_art_key<Key>{verifier.coerce_key(k2)}, match,
              true /*fwd*/);
      UNODB_EXPECT_TRUE(it.valid());
      UNODB_EXPECT_TRUE(match);
      UNODB_EXPECT_EQ(decode(it.get_key()), k2);
      UNODB_EXPECT_TRUE(
          std::ranges::equal(it.get_val(), unodb::test::test_values[2]));
    }
  }
  {    // exact match, reverse traversal
    {  // exact match, reverse traversal (LTE), first key.
      bool match = false;
      auto it = db.test_only_iterator();
      it.seek(unodb::detail::basic_art_key<Key>{verifier.coerce_key(k0)}, match,
              false /*fwd*/);
      UNODB_EXPECT_TRUE(it.valid());
      UNODB_EXPECT_TRUE(match);
      UNODB_EXPECT_EQ(decode(it.get_key()), k0);
      UNODB_EXPECT_TRUE(
          std::ranges::equal(it.get_val(), unodb::test::test_values[0]));
    }
    {  // exact match, reverse traversal (LTE), middle key.
      bool match = false;
      auto it = db.test_only_iterator();
      it.seek(unodb::detail::basic_art_key<Key>{verifier.coerce_key(k1)}, match,
              false /*fwd*/);
      UNODB_EXPECT_TRUE(it.valid());
      UNODB_EXPECT_TRUE(match);
      UNODB_EXPECT_EQ(decode(it.get_key()), k1);
      UNODB_EXPECT_TRUE(
          std::ranges::equal(it.get_val(), unodb::test::test_values[1]));
    }
    {  // exact match, reverse traversal (LTE), last key.
      bool match = false;
      auto it = db.test_only_iterator();
      it.seek(unodb::detail::basic_art_key<Key>{verifier.coerce_key(k2)}, match,
              false /*fwd*/);
      UNODB_EXPECT_TRUE(it.valid());
      UNODB_EXPECT_TRUE(match);
      UNODB_EXPECT_EQ(decode(it.get_key()), k2);
      UNODB_EXPECT_TRUE(
          std::ranges::equal(it.get_val(), unodb::test::test_values[2]));
    }
  }
  {    // before and after the first and last key
    {  // forward traversal, before the first key in the data.
      // match=false and iterator is positioned on the first key in the
      // data.
      bool match = true;
      auto it = db.test_only_iterator();
      it.seek(unodb::detail::basic_art_key<Key>{verifier.coerce_key(0)}, match,
              true /*fwd*/);
      if (debug) {
        std::cerr << "it.seek(0,&match,true)::\n";
        it.dump(std::cerr);
      }
      UNODB_EXPECT_TRUE(it.valid());
      UNODB_EXPECT_FALSE(match);
      UNODB_EXPECT_EQ(decode(it.get_key()), k0);
      UNODB_EXPECT_TRUE(
          std::ranges::equal(it.get_val(), unodb::test::test_values[0]));
    }
    {  // forward traversal, after the last key in the data.
       // match=false and iterator is invalidated.
      bool match = true;
      auto it = db.test_only_iterator();
      it.seek(unodb::detail::basic_art_key<Key>{verifier.coerce_key(0xffff)},
              match, true /*fwd*/);
      if (debug) {
        std::cerr << "it.seek(0xffff,&match,true)::\n";
        it.dump(std::cerr);
      }
      UNODB_EXPECT_FALSE(it.valid());
      UNODB_EXPECT_FALSE(match);
    }
    {
      {  // reverse traversal, before the first key in the data.
        // match=false and iterator is invalidated.
        bool match = true;
        auto it = db.test_only_iterator();
        it.seek(unodb::detail::basic_art_key<Key>{verifier.coerce_key(0)},
                match, false /*fwd*/);
        if (debug) {
          std::cerr << "it.seek(0,&match,true)::\n";
          it.dump(std::cerr);
        }
        UNODB_EXPECT_FALSE(it.valid());
        UNODB_EXPECT_FALSE(match);
      }
      {  // reverse traversal, after the last key in the data.
         // match=false and iterator is positioned at the last key.
        bool match = true;
        auto it = db.test_only_iterator();
        it.seek(unodb::detail::basic_art_key<Key>{verifier.coerce_key(0xffff)},
                match, false /*fwd*/);
        if (debug) {
          std::cerr << "it.seek(0xffff,&match,false)::\n";
          it.dump(std::cerr);
        }
        UNODB_EXPECT_TRUE(it.valid());
        UNODB_EXPECT_FALSE(match);
        UNODB_EXPECT_EQ(decode(it.get_key()), k2);
        UNODB_EXPECT_TRUE(
            std::ranges::equal(it.get_val(), unodb::test::test_values[2]));
        it.next();
        UNODB_EXPECT_FALSE(it.valid());
      }
    }
  }
}